

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathCompExprAdd(xmlXPathParserContextPtr ctxt,int ch1,int ch2,xmlXPathOp op,int value,
                       int value2,int value3,void *value4,void *value5)

{
  int iVar1;
  xmlXPathCompExprPtr pxVar2;
  int iVar3;
  xmlXPathStepOp *pxVar4;
  xmlChar *pxVar5;
  long lVar6;
  
  pxVar2 = ctxt->comp;
  iVar3 = pxVar2->nbStep;
  iVar1 = pxVar2->maxStep;
  if (iVar3 < iVar1) {
    pxVar4 = pxVar2->steps;
LAB_001d526e:
    pxVar2->last = iVar3;
    lVar6 = (long)iVar3;
    pxVar4[lVar6].ch1 = ch1;
    pxVar4[lVar6].ch2 = ch2;
    pxVar4[lVar6].op = op;
    pxVar4[lVar6].value = value;
    pxVar4[lVar6].value2 = value2;
    pxVar4[lVar6].value3 = value3;
    if (((pxVar2->dict == (xmlDictPtr)0x0) || (XPATH_OP_FUNCTION < op)) ||
       ((0x3400U >> (op & (XPATH_OP_FILTER|XPATH_OP_PREDICATE)) & 1) == 0)) {
      pxVar4[lVar6].value4 = value4;
      pxVar4[lVar6].value5 = value5;
    }
    else {
      if (value4 == (void *)0x0) {
        pxVar4[lVar6].value4 = (void *)0x0;
      }
      else {
        pxVar5 = xmlDictLookup(pxVar2->dict,(xmlChar *)value4,-1);
        pxVar2->steps[pxVar2->nbStep].value4 = pxVar5;
        (*xmlFree)(value4);
      }
      if (value5 == (void *)0x0) {
        pxVar4 = pxVar2->steps;
        iVar3 = pxVar2->nbStep;
        lVar6 = (long)iVar3;
        pxVar4[lVar6].value5 = (void *)0x0;
      }
      else {
        pxVar5 = xmlDictLookup(pxVar2->dict,(xmlChar *)value5,-1);
        pxVar2->steps[pxVar2->nbStep].value5 = pxVar5;
        (*xmlFree)(value5);
        pxVar4 = pxVar2->steps;
        iVar3 = pxVar2->nbStep;
        lVar6 = (long)iVar3;
      }
    }
    pxVar4[lVar6].cache = (xmlXPathFunction)0x0;
    pxVar2->nbStep = iVar3 + 1;
  }
  else {
    if (iVar1 < 1000000) {
      pxVar2->maxStep = iVar1 * 2;
      pxVar4 = (xmlXPathStepOp *)(*xmlRealloc)(pxVar2->steps,(long)iVar1 * 0x70);
      if (pxVar4 != (xmlXPathStepOp *)0x0) {
        pxVar2->steps = pxVar4;
        iVar3 = pxVar2->nbStep;
        goto LAB_001d526e;
      }
      pxVar2->maxStep = pxVar2->maxStep / 2;
    }
    xmlXPathPErrMemory(ctxt,"adding step\n");
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int
xmlXPathCompExprAdd(xmlXPathParserContextPtr ctxt, int ch1, int ch2,
   xmlXPathOp op, int value,
   int value2, int value3, void *value4, void *value5) {
    xmlXPathCompExprPtr comp = ctxt->comp;
    if (comp->nbStep >= comp->maxStep) {
	xmlXPathStepOp *real;

        if (comp->maxStep >= XPATH_MAX_STEPS) {
	    xmlXPathPErrMemory(ctxt, "adding step\n");
	    return(-1);
        }
	comp->maxStep *= 2;
	real = (xmlXPathStepOp *) xmlRealloc(comp->steps,
		                      comp->maxStep * sizeof(xmlXPathStepOp));
	if (real == NULL) {
	    comp->maxStep /= 2;
	    xmlXPathPErrMemory(ctxt, "adding step\n");
	    return(-1);
	}
	comp->steps = real;
    }
    comp->last = comp->nbStep;
    comp->steps[comp->nbStep].ch1 = ch1;
    comp->steps[comp->nbStep].ch2 = ch2;
    comp->steps[comp->nbStep].op = op;
    comp->steps[comp->nbStep].value = value;
    comp->steps[comp->nbStep].value2 = value2;
    comp->steps[comp->nbStep].value3 = value3;
    if ((comp->dict != NULL) &&
        ((op == XPATH_OP_FUNCTION) || (op == XPATH_OP_VARIABLE) ||
	 (op == XPATH_OP_COLLECT))) {
        if (value4 != NULL) {
	    comp->steps[comp->nbStep].value4 = (xmlChar *)
	        (void *)xmlDictLookup(comp->dict, value4, -1);
	    xmlFree(value4);
	} else
	    comp->steps[comp->nbStep].value4 = NULL;
        if (value5 != NULL) {
	    comp->steps[comp->nbStep].value5 = (xmlChar *)
	        (void *)xmlDictLookup(comp->dict, value5, -1);
	    xmlFree(value5);
	} else
	    comp->steps[comp->nbStep].value5 = NULL;
    } else {
	comp->steps[comp->nbStep].value4 = value4;
	comp->steps[comp->nbStep].value5 = value5;
    }
    comp->steps[comp->nbStep].cache = NULL;
    return(comp->nbStep++);
}